

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall testing::internal::UnitTestImpl::RegisterParameterizedTests(UnitTestImpl *this)

{
  pointer ppPVar1;
  ParameterizedTestSuiteInfoBase **test_suite_info;
  pointer ppPVar2;
  
  if (this->parameterized_tests_registered_ == false) {
    ppPVar1 = (this->parameterized_test_registry_).test_suite_infos_.
              super__Vector_base<testing::internal::ParameterizedTestSuiteInfoBase_*,_std::allocator<testing::internal::ParameterizedTestSuiteInfoBase_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppPVar2 = (this->parameterized_test_registry_).test_suite_infos_.
                   super__Vector_base<testing::internal::ParameterizedTestSuiteInfoBase_*,_std::allocator<testing::internal::ParameterizedTestSuiteInfoBase_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppPVar2 != ppPVar1;
        ppPVar2 = ppPVar2 + 1) {
      (**(code **)(*(long *)*ppPVar2 + 0x20))();
    }
    this->parameterized_tests_registered_ = true;
  }
  return;
}

Assistant:

void UnitTestImpl::RegisterParameterizedTests() {
  if (!parameterized_tests_registered_) {
    parameterized_test_registry_.RegisterTests();
    parameterized_tests_registered_ = true;
  }
}